

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_combo_begin_symbol(nk_context *ctx,nk_symbol_type symbol,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_color foreground;
  nk_symbol_type type;
  nk_window *win;
  nk_rect r;
  nk_widget_layout_states nVar2;
  int iVar3;
  nk_color *pnVar4;
  long lVar5;
  nk_color c;
  nk_context *i;
  nk_style_combo *pnVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar10;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect content;
  nk_rect header_00;
  nk_rect header;
  float local_a8;
  float local_98;
  float fStack_94;
  nk_rect local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, win != (nk_window *)0x0)) &&
     (win->layout != (nk_panel *)0x0)) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    nVar2 = nk_widget(&local_88,ctx);
    if (nVar2 != NK_WIDGET_INVALID) {
      i = ctx;
      if ((win->layout->flags & 0x800) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar2 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      r.w = local_88.w;
      r.h = local_88.h;
      r.x = local_88.x;
      r.y = local_88.y;
      local_78 = local_88.h;
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      iVar3 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      if ((ctx->last_widget_state & 0x20) == 0) {
        pnVar4 = &(ctx->style).combo.symbol_hover;
        if ((ctx->last_widget_state & 0x10) == 0) {
          pnVar6 = &(ctx->style).combo;
        }
        else {
          pnVar6 = (nk_style_combo *)&(ctx->style).combo.hover;
        }
      }
      else {
        pnVar6 = (nk_style_combo *)&(ctx->style).combo.active;
        pnVar4 = &(ctx->style).combo.symbol_active;
      }
      foreground = *pnVar4;
      if ((pnVar6->normal).type == NK_STYLE_ITEM_IMAGE) {
        r_00.w = local_88.w;
        r_00.h = local_88.h;
        r_00.x = local_88.x;
        r_00.y = local_88.y;
        nk_draw_image(&win->buffer,r_00,&(pnVar6->normal).data.image,(nk_color)0xffffffff);
        c.r = '\0';
        c.g = '\0';
        c.b = '\0';
        c.a = '\0';
      }
      else {
        c = (pnVar6->normal).data.color;
        rect.w = local_88.w;
        rect.h = local_88.h;
        rect.x = local_88.x;
        rect.y = local_88.y;
        nk_fill_rect(&win->buffer,rect,(ctx->style).combo.rounding,c);
        rect_00.w = local_88.w;
        rect_00.h = local_88.h;
        rect_00.x = local_88.x;
        rect_00.y = local_88.y;
        nk_stroke_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar5 = 0x1bcc;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar5 = (ulong)(iVar3 != 0) * 8 + 0x1bc8;
      }
      type = *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar5);
      fVar9 = (ctx->style).combo.button_padding.y;
      local_98 = local_88.x;
      fStack_94 = local_88.y;
      local_a8 = local_88.w;
      fVar10 = ((local_98 + local_a8) - local_78) - fVar9;
      local_50.h = local_78 - (fVar9 + fVar9);
      nVar1 = (ctx->style).combo.button.padding;
      fVar7 = nVar1.x;
      fVar8 = nVar1.y;
      local_50.x = fVar10 + fVar7;
      local_50.y = fStack_94 + fVar9 + fVar8;
      local_50.w = local_50.h - (fVar7 + fVar7);
      local_50.h = local_50.h - (fVar8 + fVar8);
      nVar1 = (ctx->style).combo.content_padding;
      fVar9 = nVar1.y;
      local_40.h = local_78 - (fVar9 + fVar9);
      content.x = nVar1.x + local_98;
      content.y = fVar9 + fStack_94;
      local_40.y = content.y;
      local_40.x = content.x;
      content.w = (fVar10 - fVar9) - content.x;
      content.h = local_40.h;
      local_40.w = content.w;
      nk_draw_symbol(&win->buffer,symbol,content,c,foreground,1.0,(ctx->style).font);
      nk_draw_button_symbol
                (&win->buffer,&local_40,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,
                 type,(ctx->style).font);
      header_00.w = local_88.w;
      header_00.h = local_88.h;
      header_00.x = local_88.x;
      header_00.y = local_88.y;
      iVar3 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,(uint)(iVar3 != 0),header_00);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

NK_API int
nk_combo_begin_symbol(struct nk_context *ctx, enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color sym_background;
    struct nk_color symbol_color;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_hover;
    }

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        sym_background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        sym_background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect bounds = {0,0,0,0};
        struct nk_rect content;
        struct nk_rect button;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.y;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw symbol */
        bounds.h = header.h - 2 * style->combo.content_padding.y;
        bounds.y = header.y + style->combo.content_padding.y;
        bounds.x = header.x + style->combo.content_padding.x;
        bounds.w = (button.x - style->combo.content_padding.y) - bounds.x;
        nk_draw_symbol(&win->buffer, symbol, bounds, sym_background, symbol_color,
            1.0f, style->font);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &bounds, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}